

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::GetNextTokenAsString(XFileParser *this,string *poString)

{
  Scene *pSVar1;
  char *pcVar2;
  char *pcVar3;
  string local_38;
  
  if (this->mIsBinaryFormat == true) {
    GetNextToken_abi_cxx11_(&local_38,this);
    std::__cxx11::string::operator=((string *)poString,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    FindNextNoneWhiteSpace(this);
    pcVar3 = this->mP;
    pcVar2 = this->mEnd;
    if (pcVar2 <= pcVar3) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
      }
      operator_delete(pSVar1);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Unexpected end of file while parsing string","");
      ThrowException(this,&local_38);
    }
    if (*pcVar3 != '\"') {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
      }
      operator_delete(pSVar1);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Expected quotation mark.","");
      ThrowException(this,&local_38);
    }
    pcVar3 = pcVar3 + 1;
    this->mP = pcVar3;
    while ((pcVar3 < pcVar2 && (*pcVar3 != '\"'))) {
      this->mP = pcVar3 + 1;
      std::__cxx11::string::append((char *)poString,(ulong)pcVar3);
      pcVar2 = this->mEnd;
      pcVar3 = this->mP;
    }
    if (pcVar2 + -1 <= pcVar3) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
      }
      operator_delete(pSVar1);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Unexpected end of file while parsing string","");
      ThrowException(this,&local_38);
    }
    if ((pcVar3[1] != ';') || (*pcVar3 != '\"')) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
      }
      operator_delete(pSVar1);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Expected quotation mark and semicolon at the end of a string."
                 ,"");
      ThrowException(this,&local_38);
    }
    this->mP = pcVar3 + 2;
  }
  return;
}

Assistant:

void XFileParser::GetNextTokenAsString( std::string& poString)
{
    if( mIsBinaryFormat)
    {
        poString = GetNextToken();
        return;
    }

    FindNextNoneWhiteSpace();
    if ( mP >= mEnd ) {
        delete mScene;
        ThrowException( "Unexpected end of file while parsing string" );
    }

    if ( *mP != '"' ) {
        delete mScene;
        ThrowException( "Expected quotation mark." );
    }
    ++mP;

    while( mP < mEnd && *mP != '"')
        poString.append( mP++, 1);

    if ( mP >= mEnd - 1 ) {
        delete mScene;
        ThrowException( "Unexpected end of file while parsing string" );
    }

    if ( mP[ 1 ] != ';' || mP[ 0 ] != '"' ) {
        delete mScene;
        ThrowException( "Expected quotation mark and semicolon at the end of a string." );
    }
    mP+=2;
}